

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_127a7::TestCheckCloseWithZeroEpsilonWorksForSameNumber::RunImpl
          (TestCheckCloseWithZeroEpsilonWorksForSameNumber *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  float local_6c;
  float local_68;
  int local_64;
  TestDetails local_60;
  TestResults results;
  
  UnitTest::TestResults::TestResults(&results,(TestReporter *)0x0);
  local_68 = 0.1;
  local_6c = 0.1;
  local_64 = 0;
  UnitTest::TestDetails::TestDetails(&local_60,"","","",0);
  UnitTest::CheckClose<float,float,int>(&results,&local_68,&local_6c,&local_64,&local_60);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_68 = 0.0;
  local_6c = (float)UnitTest::TestResults::GetFailureCount(&results);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_60,*ppTVar2,0x75);
  UnitTest::CheckEqual<int,int>(results_00,(int *)&local_68,(int *)&local_6c,&local_60);
  return;
}

Assistant:

TEST(CheckCloseWithZeroEpsilonWorksForSameNumber)
{
    TestResults results;
    CheckClose(results, 0.1f, 0.1f, 0, TestDetails("", "", "", 0));
    CHECK_EQUAL(0, results.GetFailureCount());
}